

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::set_motion_vector
               (Ref<embree::SceneGraph::Node> *node,avector<Vec3fa> *motion_vector)

{
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this;
  float *pfVar1;
  Vec3fa *pVVar2;
  float *pfVar3;
  Node *pNVar4;
  size_t sVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  *this_00;
  ulong uVar19;
  size_t t;
  bool bVar20;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> local_78;
  long *local_58;
  long *local_50;
  long *local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar4 = node->ptr;
  if (pNVar4 != (Node *)0x0) {
    plVar14 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&TransformNode::typeinfo);
    if (plVar14 == (long *)0x0) {
      plVar14 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&GroupNode::typeinfo);
      if (plVar14 == (long *)0x0) {
        plVar14 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&TriangleMeshNode::typeinfo);
        if (plVar14 == (long *)0x0) {
          plVar14 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&QuadMeshNode::typeinfo);
          if (plVar14 == (long *)0x0) {
            plVar14 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&GridMeshNode::typeinfo);
            if (plVar14 == (long *)0x0) {
              plVar15 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&HairSetNode::typeinfo);
              local_58 = plVar15;
              if (plVar15 == (long *)0x0) {
                plVar15 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&PointSetNode::typeinfo);
                local_48 = plVar15;
                if (plVar15 == (long *)0x0) {
                  local_50 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&SubdivMeshNode::typeinfo
                                                   );
                  if (local_50 == (long *)0x0) {
                    return;
                  }
                  (**(code **)(*local_50 + 0x10))(local_50);
                  this_00 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                             *)(local_50 + 0xe);
                  lVar17 = local_50[0xe];
                  sVar5 = *(size_t *)(lVar17 + 8);
                  pvVar6 = *(void **)(lVar17 + 0x18);
                  *(undefined8 *)(lVar17 + 8) = 0;
                  *(undefined8 *)(lVar17 + 0x10) = 0;
                  *(undefined8 *)(lVar17 + 0x18) = 0;
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)this_00);
                  for (uVar19 = 0; uVar19 < motion_vector->size_active; uVar19 = uVar19 + 1) {
                    local_78.items = (Vec3fx *)0x0;
                    local_78.size_active = 0;
                    local_78.size_alloced = 0;
                    if (sVar5 != 0) {
                      local_78.items = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
                      local_78.size_alloced = sVar5;
                    }
                    lVar17 = 0;
                    sVar18 = sVar5;
                    while (bVar20 = sVar18 != 0, sVar18 = sVar18 - 1, bVar20) {
                      pfVar3 = (float *)((long)pvVar6 + lVar17);
                      fVar7 = pfVar3[1];
                      fVar8 = pfVar3[2];
                      fVar9 = pfVar3[3];
                      pVVar2 = motion_vector->items + uVar19;
                      fVar10 = (pVVar2->field_0).m128[1];
                      fVar11 = (pVVar2->field_0).m128[2];
                      fVar12 = (pVVar2->field_0).m128[3];
                      pfVar1 = (float *)((long)&(local_78.items)->field_0 + lVar17);
                      *pfVar1 = *pfVar3 + (pVVar2->field_0).m128[0];
                      pfVar1[1] = fVar7 + fVar10;
                      pfVar1[2] = fVar8 + fVar11;
                      pfVar1[3] = fVar9 + fVar12;
                      lVar17 = lVar17 + 0x10;
                    }
                    local_78.size_active = local_78.size_alloced;
                    std::
                    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    ::
                    emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                              (this_00,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                        *)&local_78);
                    alignedFree(local_78.items);
                  }
                  alignedFree(pvVar6);
                  (**(code **)(*local_50 + 0x18))();
                }
                else {
                  (**(code **)(*plVar15 + 0x10))(plVar15);
                  lVar17 = plVar15[0xf];
                  sVar5 = *(size_t *)(lVar17 + 8);
                  pvVar6 = *(void **)(lVar17 + 0x18);
                  *(undefined8 *)(lVar17 + 8) = 0;
                  *(undefined8 *)(lVar17 + 0x10) = 0;
                  *(undefined8 *)(lVar17 + 0x18) = 0;
                  local_50 = plVar15;
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::clear((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                           *)(plVar15 + 0xf));
                  for (uVar19 = 0; plVar13 = local_50, uVar16 = motion_vector->size_active,
                      uVar19 < uVar16; uVar19 = uVar19 + 1) {
                    local_78.items = (Vec3fx *)0x0;
                    local_78.size_active = 0;
                    local_78.size_alloced = 0;
                    if (sVar5 != 0) {
                      local_78.items = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
                      local_78.size_alloced = sVar5;
                    }
                    lVar17 = 0;
                    sVar18 = sVar5;
                    while (bVar20 = sVar18 != 0, sVar18 = sVar18 - 1, bVar20) {
                      pVVar2 = motion_vector->items + uVar19;
                      fVar7 = (pVVar2->field_0).m128[1];
                      fVar8 = (pVVar2->field_0).m128[2];
                      pfVar3 = (float *)((long)pvVar6 + lVar17);
                      fVar9 = pfVar3[1];
                      fVar10 = pfVar3[2];
                      fVar11 = pfVar3[3];
                      pfVar1 = (float *)((long)&(local_78.items)->field_0 + lVar17);
                      *pfVar1 = (pVVar2->field_0).m128[0] + *pfVar3;
                      pfVar1[1] = fVar7 + fVar9;
                      pfVar1[2] = fVar8 + fVar10;
                      pfVar1[3] = fVar11 + 0.0;
                      lVar17 = lVar17 + 0x10;
                    }
                    local_78.size_active = local_78.size_alloced;
                    std::
                    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    ::
                    emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                                *)(plVar15 + 0xf),&local_78);
                    alignedFree(local_78.items);
                  }
                  if (local_50[0x13] != local_50[0x12]) {
                    this = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            *)(local_48 + 0x12);
                    for (uVar19 = 1; uVar19 < uVar16; uVar19 = uVar19 + 1) {
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::push_back(this,(this->
                                       super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
                      uVar16 = motion_vector->size_active;
                    }
                  }
                  alignedFree(pvVar6);
                  (**(code **)(*plVar13 + 0x18))();
                }
              }
              else {
                (**(code **)(*plVar15 + 0x10))(plVar15);
                lVar17 = plVar15[0xf];
                sVar5 = *(size_t *)(lVar17 + 8);
                pvVar6 = *(void **)(lVar17 + 0x18);
                *(undefined8 *)(lVar17 + 8) = 0;
                *(undefined8 *)(lVar17 + 0x10) = 0;
                *(undefined8 *)(lVar17 + 0x18) = 0;
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::clear((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)(plVar15 + 0xf));
                for (uVar19 = 0; uVar19 < motion_vector->size_active; uVar19 = uVar19 + 1) {
                  local_78.items = (Vec3fx *)0x0;
                  local_78.size_active = 0;
                  local_78.size_alloced = 0;
                  if (sVar5 != 0) {
                    local_78.items = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
                    local_78.size_alloced = sVar5;
                  }
                  lVar17 = 0;
                  sVar18 = sVar5;
                  while (bVar20 = sVar18 != 0, sVar18 = sVar18 - 1, bVar20) {
                    pVVar2 = motion_vector->items + uVar19;
                    fVar7 = (pVVar2->field_0).m128[1];
                    fVar8 = (pVVar2->field_0).m128[2];
                    pfVar1 = (float *)((long)pvVar6 + lVar17);
                    fVar9 = pfVar1[1];
                    fVar10 = pfVar1[2];
                    fVar11 = pfVar1[3];
                    pfVar3 = (float *)((long)&(local_78.items)->field_0 + lVar17);
                    *pfVar3 = (pVVar2->field_0).m128[0] + *pfVar1;
                    pfVar3[1] = fVar7 + fVar9;
                    pfVar3[2] = fVar8 + fVar10;
                    pfVar3[3] = fVar11 + 0.0;
                    lVar17 = lVar17 + 0x10;
                  }
                  local_78.size_active = local_78.size_alloced;
                  std::
                  vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  ::
                  emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                            ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                              *)(plVar15 + 0xf),&local_78);
                  alignedFree(local_78.items);
                }
                alignedFree(pvVar6);
                (**(code **)(*local_58 + 0x18))();
              }
              plVar15 = (long *)0x0;
            }
            else {
              (**(code **)(*plVar14 + 0x10))(plVar14);
              lVar17 = plVar14[0xe];
              sVar5 = *(size_t *)(lVar17 + 8);
              pvVar6 = *(void **)(lVar17 + 0x18);
              *(undefined8 *)(lVar17 + 8) = 0;
              *(undefined8 *)(lVar17 + 0x10) = 0;
              *(undefined8 *)(lVar17 + 0x18) = 0;
              local_58 = plVar14;
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       *)(plVar14 + 0xe));
              for (uVar19 = 0; uVar19 < motion_vector->size_active; uVar19 = uVar19 + 1) {
                local_78.items = (Vec3fx *)0x0;
                local_78.size_active = 0;
                local_78.size_alloced = 0;
                if (sVar5 != 0) {
                  local_78.items = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
                  local_78.size_alloced = sVar5;
                }
                lVar17 = 0;
                sVar18 = sVar5;
                while (bVar20 = sVar18 != 0, sVar18 = sVar18 - 1, bVar20) {
                  pfVar1 = (float *)((long)pvVar6 + lVar17);
                  fVar7 = pfVar1[1];
                  fVar8 = pfVar1[2];
                  fVar9 = pfVar1[3];
                  pVVar2 = motion_vector->items + uVar19;
                  fVar10 = (pVVar2->field_0).m128[1];
                  fVar11 = (pVVar2->field_0).m128[2];
                  fVar12 = (pVVar2->field_0).m128[3];
                  pfVar3 = (float *)((long)&(local_78.items)->field_0 + lVar17);
                  *pfVar3 = *pfVar1 + (pVVar2->field_0).m128[0];
                  pfVar3[1] = fVar7 + fVar10;
                  pfVar3[2] = fVar8 + fVar11;
                  pfVar3[3] = fVar9 + fVar12;
                  lVar17 = lVar17 + 0x10;
                }
                local_78.size_active = local_78.size_alloced;
                std::
                vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                ::
                emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                          ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                            *)(plVar14 + 0xe),
                           (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                            *)&local_78);
                alignedFree(local_78.items);
              }
              alignedFree(pvVar6);
              plVar15 = local_58;
            }
            if (plVar14 != (long *)0x0) {
              (**(code **)(*plVar15 + 0x18))();
            }
          }
          else {
            (**(code **)(*plVar14 + 0x10))(plVar14);
            lVar17 = plVar14[0xe];
            sVar5 = *(size_t *)(lVar17 + 8);
            pvVar6 = *(void **)(lVar17 + 0x18);
            *(undefined8 *)(lVar17 + 8) = 0;
            *(undefined8 *)(lVar17 + 0x10) = 0;
            *(undefined8 *)(lVar17 + 0x18) = 0;
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     *)(plVar14 + 0xe));
            for (uVar19 = 0; uVar19 < motion_vector->size_active; uVar19 = uVar19 + 1) {
              local_78.items = (Vec3fx *)0x0;
              local_78.size_active = 0;
              local_78.size_alloced = 0;
              if (sVar5 != 0) {
                local_78.items = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
                local_78.size_alloced = sVar5;
              }
              lVar17 = 0;
              sVar18 = sVar5;
              while (bVar20 = sVar18 != 0, sVar18 = sVar18 - 1, bVar20) {
                pfVar1 = (float *)((long)pvVar6 + lVar17);
                fVar7 = pfVar1[1];
                fVar8 = pfVar1[2];
                fVar9 = pfVar1[3];
                pVVar2 = motion_vector->items + uVar19;
                fVar10 = (pVVar2->field_0).m128[1];
                fVar11 = (pVVar2->field_0).m128[2];
                fVar12 = (pVVar2->field_0).m128[3];
                pfVar3 = (float *)((long)&(local_78.items)->field_0 + lVar17);
                *pfVar3 = *pfVar1 + (pVVar2->field_0).m128[0];
                pfVar3[1] = fVar7 + fVar10;
                pfVar3[2] = fVar8 + fVar11;
                pfVar3[3] = fVar9 + fVar12;
                lVar17 = lVar17 + 0x10;
              }
              local_78.size_active = local_78.size_alloced;
              std::
              vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              ::
              emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                        ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                          *)(plVar14 + 0xe),
                         (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                          *)&local_78);
              alignedFree(local_78.items);
            }
            alignedFree(pvVar6);
            (**(code **)(*plVar14 + 0x18))();
          }
        }
        else {
          (**(code **)(*plVar14 + 0x10))(plVar14);
          lVar17 = plVar14[0xe];
          sVar5 = *(size_t *)(lVar17 + 8);
          pvVar6 = *(void **)(lVar17 + 0x18);
          *(undefined8 *)(lVar17 + 8) = 0;
          *(undefined8 *)(lVar17 + 0x10) = 0;
          *(undefined8 *)(lVar17 + 0x18) = 0;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)(plVar14 + 0xe));
          for (uVar19 = 0; uVar19 < motion_vector->size_active; uVar19 = uVar19 + 1) {
            local_78.items = (Vec3fx *)0x0;
            local_78.size_active = 0;
            local_78.size_alloced = 0;
            if (sVar5 != 0) {
              local_78.items = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
              local_78.size_alloced = sVar5;
            }
            lVar17 = 0;
            sVar18 = sVar5;
            while (bVar20 = sVar18 != 0, sVar18 = sVar18 - 1, bVar20) {
              pfVar1 = (float *)((long)pvVar6 + lVar17);
              fVar7 = pfVar1[1];
              fVar8 = pfVar1[2];
              fVar9 = pfVar1[3];
              pVVar2 = motion_vector->items + uVar19;
              fVar10 = (pVVar2->field_0).m128[1];
              fVar11 = (pVVar2->field_0).m128[2];
              fVar12 = (pVVar2->field_0).m128[3];
              pfVar3 = (float *)((long)&(local_78.items)->field_0 + lVar17);
              *pfVar3 = *pfVar1 + (pVVar2->field_0).m128[0];
              pfVar3[1] = fVar7 + fVar10;
              pfVar3[2] = fVar8 + fVar11;
              pfVar3[3] = fVar9 + fVar12;
              lVar17 = lVar17 + 0x10;
            }
            local_78.size_active = local_78.size_alloced;
            std::
            vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                      ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                        *)(plVar14 + 0xe),
                       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *
                       )&local_78);
            alignedFree(local_78.items);
          }
          alignedFree(pvVar6);
          (**(code **)(*plVar14 + 0x18))();
        }
      }
      else {
        (**(code **)(*plVar14 + 0x10))(plVar14);
        for (uVar19 = 0; uVar19 < (ulong)(plVar14[0xe] - plVar14[0xd] >> 3); uVar19 = uVar19 + 1) {
          pNVar4 = *(Node **)(plVar14[0xd] + uVar19 * 8);
          local_40.ptr = pNVar4;
          if (pNVar4 != (Node *)0x0) {
            (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
          }
          set_motion_vector(&local_40,motion_vector);
          if (pNVar4 != (Node *)0x0) {
            (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
          }
        }
        (**(code **)(*plVar14 + 0x18))(plVar14);
      }
    }
    else {
      (**(code **)(*plVar14 + 0x10))(plVar14);
      pNVar4 = (Node *)plVar14[0x13];
      local_38.ptr = pNVar4;
      if (pNVar4 != (Node *)0x0) {
        (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
      }
      set_motion_vector(&local_38,motion_vector);
      if (pNVar4 != (Node *)0x0) {
        (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
      }
      (**(code **)(*plVar14 + 0x18))(plVar14);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }